

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O2

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  pointer puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  
  uVar3 = this->m_num_bits & 0x3f;
  if (((uVar3 == 0) || (puVar2 = m_highest_block(this), *puVar2 >> (sbyte)uVar3 == 0)) &&
     (puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
     uVar3 = (long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
     uVar3 <= (ulong)((long)(this->m_bits).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1))) {
    return (long)uVar3 >> 3 ==
           ((this->m_num_bits >> 6) + 1) - (ulong)((this->m_num_bits & 0x3f) == 0);
  }
  return false;
}

Assistant:

bool dynamic_bitset<Block, Allocator>::m_check_invariants() const
{
    const block_width_type extra_bits = count_extra_bits();
    if (extra_bits > 0) {
        block_type const mask = (~static_cast<Block>(0) << extra_bits);
        if ((m_highest_block() & mask) != 0)
            return false;
    }
    if (m_bits.size() > m_bits.capacity() || num_blocks() != calc_num_blocks(size()))
        return false;

    return true;

}